

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

ssize_t uv__fs_read(uv_fs_t *req)

{
  uint __count;
  uv_buf_t *__iovec;
  size_t __nbytes;
  ssize_t sVar1;
  long lVar2;
  ssize_t sVar3;
  int *piVar4;
  off_t nread;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  lVar2 = req->off;
  __count = req->nbufs;
  if (lVar2 < 0) {
    __iovec = req->bufs;
    if (__count == 1) {
      sVar1 = read(req->file,__iovec->base,__iovec->len);
      return sVar1;
    }
    sVar1 = readv(req->file,(iovec *)__iovec,__count);
    return sVar1;
  }
  if (__count == 1) {
    sVar1 = pread64(req->file,req->bufs->base,req->bufs->len,lVar2);
    return sVar1;
  }
  if (uv__fs_read_no_preadv != '\x01') {
    sVar3 = uv__preadv(req->file,(iovec *)req->bufs,__count,lVar2);
    if (sVar3 != -1) {
      return sVar3;
    }
    piVar4 = __errno_location();
    if (*piVar4 != 0x26) {
      return -1;
    }
    uv__fs_read_no_preadv = '\x01';
  }
  uVar6 = 1;
  lVar7 = 8;
  lVar2 = 1;
  lVar5 = 0;
  do {
    __nbytes = *(size_t *)((long)&req->bufs->base + lVar7);
    if (__nbytes != 0) {
      lVar2 = pread64(req->file,*(void **)((long)req->bufs + lVar7 + -8),__nbytes,req->off + lVar5);
      sVar1 = lVar2;
      if (lVar2 < 1) {
        sVar1 = 0;
      }
      lVar5 = lVar5 + sVar1;
    }
    if (req->nbufs <= uVar6) break;
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x10;
  } while (0 < lVar2);
  if (0 < lVar5) {
    lVar2 = lVar5;
  }
  return lVar2;
}

Assistant:

static ssize_t uv__fs_read(uv_fs_t* req) {
#if defined(__linux__)
  static int no_preadv;
#endif
  ssize_t result;

#if defined(_AIX)
  struct stat buf;
  if(fstat(req->file, &buf))
    return -1;
  if(S_ISDIR(buf.st_mode)) {
    errno = EISDIR;
    return -1;
  }
#endif /* defined(_AIX) */
  if (req->off < 0) {
    if (req->nbufs == 1)
      result = read(req->file, req->bufs[0].base, req->bufs[0].len);
    else
      result = readv(req->file, (struct iovec*) req->bufs, req->nbufs);
  } else {
    if (req->nbufs == 1) {
      result = pread(req->file, req->bufs[0].base, req->bufs[0].len, req->off);
      goto done;
    }

#if HAVE_PREADV
    result = preadv(req->file, (struct iovec*) req->bufs, req->nbufs, req->off);
#else
# if defined(__linux__)
    if (no_preadv) retry:
# endif
    {
      off_t nread;
      size_t index;

      nread = 0;
      index = 0;
      result = 1;
      do {
        if (req->bufs[index].len > 0) {
          result = pread(req->file,
                         req->bufs[index].base,
                         req->bufs[index].len,
                         req->off + nread);
          if (result > 0)
            nread += result;
        }
        index++;
      } while (index < req->nbufs && result > 0);
      if (nread > 0)
        result = nread;
    }
# if defined(__linux__)
    else {
      result = uv__preadv(req->file,
                          (struct iovec*)req->bufs,
                          req->nbufs,
                          req->off);
      if (result == -1 && errno == ENOSYS) {
        no_preadv = 1;
        goto retry;
      }
    }
# endif
#endif
  }

done:
  return result;
}